

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void exprAnalyze(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  WhereMaskSet *pMaskSet;
  u32 *puVar1;
  u16 *puVar2;
  Bitmask *pBVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  undefined2 uVar8;
  Parse *pParse;
  sqlite3 *db;
  Expr *pIn;
  sqlite3 *psVar9;
  Select *pSVar10;
  SrcList *pSVar11;
  WhereInfo *pWVar12;
  Parse *pParse_00;
  _func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *p_Var13;
  Vdbe *p;
  char cVar14;
  char cVar15;
  u8 uVar16;
  u16 uVar17;
  short sVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  Bitmask BVar24;
  Bitmask BVar25;
  Bitmask BVar26;
  Expr *pEVar27;
  Expr *pEVar28;
  CollSeq *pCVar29;
  FuncDef *pFVar30;
  sqlite3_value *pVal;
  byte *pbVar31;
  WhereOrInfo *pWC_00;
  VTable *pVVar32;
  Expr *pEVar33;
  ulong uVar34;
  WhereOrInfo *pWC_01;
  ulong uVar35;
  WhereTerm *pWVar36;
  WhereTerm *pWVar37;
  Expr *pEVar38;
  VdbeOp *pVVar39;
  ExprList *pEVar40;
  byte bVar41;
  byte bVar42;
  long lVar43;
  u8 aff;
  uint uVar44;
  int *piVar45;
  long lVar46;
  ulong uVar47;
  WhereMaskSet *pMaskSet_00;
  ushort uVar48;
  ExprList_item *pEVar49;
  WhereTerm *pWVar50;
  char *pcVar51;
  int i;
  bool bVar52;
  bool bVar53;
  WhereTerm *local_d8;
  int aiCurCol [2];
  ulong local_48;
  void *local_38;
  
  pParse = pWC->pWInfo->pParse;
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return;
  }
  pMaskSet_00 = &pWC->pWInfo->sMaskSet;
  pIn = pWC->a[idxTerm].pExpr;
  local_d8 = pWC->a + idxTerm;
  BVar24 = sqlite3WhereExprUsage(pMaskSet_00,pIn->pLeft);
  bVar42 = pIn->op;
  if (bVar42 == 0x32) {
    local_d8->prereqRight = 0;
  }
  else {
    if (bVar42 == 0x31) {
      iVar19 = sqlite3ExprCheckIN(pParse,pIn);
      if (iVar19 != 0) {
        return;
      }
      if ((pIn->flags & 0x800) == 0) {
        BVar25 = sqlite3WhereExprListUsage(pMaskSet_00,(pIn->x).pList);
      }
      else {
        BVar25 = exprSelectUsage(pMaskSet_00,(Select *)(pIn->x).pList);
      }
    }
    else {
      BVar25 = sqlite3WhereExprUsage(pMaskSet_00,pIn->pRight);
    }
    local_d8->prereqRight = BVar25;
  }
  pMaskSet_00->bVarSelect = 0;
  BVar25 = sqlite3WhereExprUsageNN(pMaskSet_00,pIn);
  if (pMaskSet_00->bVarSelect != 0) {
    pbVar31 = (byte *)((long)&local_d8->wtFlags + 1);
    *pbVar31 = *pbVar31 | 0x10;
  }
  if ((pIn->flags & 1) == 0) {
    local_48 = 0;
  }
  else {
    BVar26 = sqlite3WhereGetMask(pMaskSet_00,(int)pIn->iRightJoinTable);
    BVar25 = BVar25 | BVar26;
    if (BVar26 <= BVar25 >> 1) {
      sqlite3ErrorMsg(pParse,"ON clause references tables to its right");
      return;
    }
    local_48 = BVar26 - 1;
  }
  local_d8->prereqAll = BVar25;
  local_d8->iParent = -1;
  local_d8->leftCursor = -1;
  local_d8->eOperator = 0;
  uVar44 = (uint)bVar42;
  if ((uVar44 < 0x3a) && ((0x3e6200000000000U >> ((ulong)uVar44 & 0x3f) & 1) != 0)) {
    pEVar27 = sqlite3ExprSkipCollate(pIn->pLeft);
    pEVar28 = sqlite3ExprSkipCollate(pIn->pRight);
    uVar48 = 0x800;
    if ((local_d8->prereqRight & BVar24) == 0) {
      uVar48 = 0x1fff;
    }
    if (0 < local_d8->iField) {
      pEVar27 = ((pEVar27->x).pList)->a[local_d8->iField - 1].pExpr;
    }
    iVar19 = exprMightBeIndexed(pSrc,BVar24,aiCurCol,pEVar27,uVar44);
    if (iVar19 != 0) {
      local_d8->leftCursor = aiCurCol[0];
      (local_d8->u).leftColumn = aiCurCol[1];
      uVar17 = operatorMask(uVar44);
      local_d8->eOperator = uVar17 & uVar48;
    }
    uVar44 = (uint)bVar42;
    if (uVar44 == 0x2d) {
      pbVar31 = (byte *)((long)&local_d8->wtFlags + 1);
      *pbVar31 = *pbVar31 | 8;
    }
    if ((pEVar28 != (Expr *)0x0) &&
       (iVar19 = exprMightBeIndexed(pSrc,local_d8->prereqRight,aiCurCol,pEVar28,uVar44), iVar19 != 0
       )) {
      if (local_d8->leftCursor < 0) {
        sVar18 = 0;
        pWVar50 = local_d8;
        pEVar27 = pIn;
      }
      else {
        pEVar27 = sqlite3ExprDup(db,pIn,0);
        if (db->mallocFailed != '\0') {
          sqlite3ExprDelete(db,pEVar27);
          return;
        }
        iVar19 = whereClauseInsert(pWC,pEVar27,3);
        if (iVar19 == 0) {
          return;
        }
        pWVar50 = pWC->a + iVar19;
        markTermAsChild(pWC,iVar19,idxTerm);
        if (uVar44 == 0x2d) {
          pbVar31 = (byte *)((long)&pWVar50->wtFlags + 1);
          *pbVar31 = *pbVar31 | 8;
        }
        local_d8 = pWC->a;
        puVar2 = &local_d8[idxTerm].wtFlags;
        *puVar2 = *puVar2 | 8;
        local_d8 = local_d8 + idxTerm;
        if (((pParse->db->dbOptFlags & 0x80) == 0) &&
           (((pEVar27->op == '5' || (pEVar27->op == '-')) && ((pEVar27->flags & 1) == 0)))) {
          cVar14 = sqlite3ExprAffinity(pEVar27->pLeft);
          cVar15 = sqlite3ExprAffinity(pEVar27->pRight);
          if ((cVar14 == cVar15) || ('B' < cVar15 && 'B' < cVar14)) {
            pCVar29 = sqlite3BinaryCompareCollSeq(pParse,pEVar27->pLeft,pEVar27->pRight);
            iVar19 = sqlite3IsBinary(pCVar29);
            if ((iVar19 != 0) ||
               (iVar19 = sqlite3ExprCollSeqMatch(pParse,pEVar27->pLeft,pEVar27->pRight), iVar19 != 0
               )) {
              pbVar31 = (byte *)((long)&local_d8->eOperator + 1);
              *pbVar31 = *pbVar31 | 8;
              sVar18 = 0x800;
              goto LAB_00176d10;
            }
          }
        }
        sVar18 = 0;
      }
LAB_00176d10:
      pEVar28 = pEVar27->pLeft;
      uVar44 = pEVar27->pRight->flags;
      if (((pEVar28->flags ^ uVar44) >> 8 & 1) == 0) {
        if ((uVar44 >> 8 & 1) == 0) {
          pCVar29 = sqlite3ExprCollSeq(pParse,pEVar28);
          pEVar28 = pEVar27->pLeft;
          if (pCVar29 != (CollSeq *)0x0) {
            pbVar31 = (byte *)((long)&pEVar28->flags + 1);
            *pbVar31 = *pbVar31 | 1;
          }
        }
        else {
          pEVar27->pRight->flags = uVar44 & 0xfffffeff;
        }
      }
      pEVar38 = pEVar27->pRight;
      pEVar27->pRight = pEVar28;
      pEVar27->pLeft = pEVar38;
      if (0x35 < pEVar27->op) {
        pEVar27->op = (pEVar27->op - 0x36 ^ 2) + 0x36;
      }
      pWVar50->leftCursor = aiCurCol[0];
      (pWVar50->u).leftColumn = aiCurCol[1];
      pWVar50->prereqRight = BVar24 | local_48;
      pWVar50->prereqAll = BVar25;
      uVar17 = operatorMask((uint)pEVar27->op);
      pWVar50->eOperator = sVar18 + uVar17 & uVar48;
    }
  }
  else if (pIn->op == '+') {
    pWVar12 = pWC->pWInfo;
    pWVar50 = pWC->a;
    pParse_00 = pWVar12->pParse;
    psVar9 = pParse_00->db;
    pEVar27 = pWVar50[idxTerm].pExpr;
    pWC_00 = (WhereOrInfo *)sqlite3DbMallocZero(psVar9,0x230);
    pWVar50[idxTerm].u.pOrInfo = pWC_00;
    if (pWC_00 != (WhereOrInfo *)0x0) {
      *(byte *)&pWVar50[idxTerm].wtFlags = (byte)pWVar50[idxTerm].wtFlags | 0x10;
      pWVar36 = (pWC_00->wc).aStatic;
      memset(pWVar36,0,0x200);
      (pWC_00->wc).pWInfo = pWVar12;
      (pWC_00->wc).hasOr = '\0';
      (pWC_00->wc).pOuter = (WhereClause *)0x0;
      (pWC_00->wc).nTerm = 0;
      (pWC_00->wc).nSlot = 8;
      (pWC_00->wc).a = pWVar36;
      sqlite3WhereSplit((WhereClause *)pWC_00,pEVar27,'+');
      sqlite3WhereExprAnalyze(pSrc,(WhereClause *)pWC_00);
      if (psVar9->mallocFailed == '\0') {
        iVar19 = (pWC_00->wc).nTerm;
        pWVar36 = (pWC_00->wc).a;
        pMaskSet = &pWVar12->sMaskSet;
        uVar47 = 0xffffffffffffffff;
        uVar34 = uVar47;
        while ((0 < iVar19 && (uVar34 != 0))) {
          uVar48 = pWVar36->eOperator;
          if ((uVar48 & 0x1ff) == 0) {
            pWC_01 = (WhereOrInfo *)sqlite3DbMallocRawNN(psVar9,0x228);
            if (pWC_01 == (WhereOrInfo *)0x0) {
              uVar47 = 0;
            }
            else {
              (pWVar36->u).pOrInfo = pWC_01;
              *(byte *)&pWVar36->wtFlags = (byte)pWVar36->wtFlags | 0x20;
              pWVar36->eOperator = 0x400;
              pWVar37 = (pWC_01->wc).aStatic;
              memset(pWVar37,0,0x200);
              (pWC_01->wc).pWInfo = pWC->pWInfo;
              (pWC_01->wc).hasOr = '\0';
              (pWC_01->wc).pOuter = (WhereClause *)0x0;
              (pWC_01->wc).nTerm = 0;
              (pWC_01->wc).nSlot = 8;
              (pWC_01->wc).a = pWVar37;
              sqlite3WhereSplit((WhereClause *)pWC_01,pWVar36->pExpr,',');
              sqlite3WhereExprAnalyze(pSrc,(WhereClause *)pWC_01);
              (pWC_01->wc).pOuter = pWC;
              if (psVar9->mallocFailed == '\0') {
                iVar23 = (pWC_01->wc).nTerm;
                if (iVar23 < 1) {
                  iVar23 = 0;
                }
                piVar45 = &((pWC_01->wc).a)->leftCursor;
                uVar47 = 0;
                while (bVar52 = iVar23 != 0, iVar23 = iVar23 + -1, bVar52) {
                  uVar35 = (ulong)((WhereTerm *)(piVar45 + -7))->pExpr->op;
                  if (((uVar35 < 0x3a) && ((0x3e6200000000000U >> (uVar35 & 0x3f) & 1) != 0)) ||
                     (*(u16 *)(piVar45 + -2) == 0x40)) {
                    BVar24 = sqlite3WhereGetMask(pMaskSet,*piVar45);
                    uVar47 = uVar47 | BVar24;
                  }
                  piVar45 = piVar45 + 0x10;
                }
              }
              else {
                uVar47 = 0;
              }
              uVar34 = uVar34 & uVar47;
              uVar47 = 0;
            }
          }
          else {
            uVar7 = pWVar36->wtFlags;
            if ((uVar7 & 8) == 0) {
              BVar24 = sqlite3WhereGetMask(pMaskSet,pWVar36->leftCursor);
              if ((uVar7 & 2) != 0) {
                BVar25 = sqlite3WhereGetMask(pMaskSet,(pWC_00->wc).a[pWVar36->iParent].leftCursor);
                BVar24 = BVar24 | BVar25;
              }
              uVar34 = uVar34 & BVar24;
              uVar47 = uVar47 & BVar24;
              if ((uVar48 & 2) == 0) {
                uVar47 = 0;
              }
            }
          }
          iVar19 = iVar19 + -1;
          pWVar36 = pWVar36 + 1;
        }
        pWC_00->indexable = uVar34;
        pWVar50[idxTerm].eOperator = 0x200;
        if ((uVar34 != 0) && (pWC->hasOr = '\x01', (pWC_00->wc).nTerm == 2)) {
          pWVar50 = (pWC_00->wc).a;
          iVar19 = 0;
          while (pWVar36 = whereNthSubterm(pWVar50,iVar19), pWVar36 != (WhereTerm *)0x0) {
            iVar19 = iVar19 + 1;
            iVar23 = 0;
            while (pWVar37 = whereNthSubterm(pWVar50 + 1,iVar23), pWVar37 != (WhereTerm *)0x0) {
              if ((((pWVar36->eOperator & 0x3e) != 0) && ((pWVar37->eOperator & 0x3e) != 0)) &&
                 ((uVar48 = pWVar37->eOperator | pWVar36->eOperator,
                  (uVar48 & 0xffe5) == 0 || (uVar48 & 0xffd9) == 0 &&
                  (((iVar20 = sqlite3ExprCompare((Parse *)0x0,pWVar36->pExpr->pLeft,
                                                 pWVar37->pExpr->pLeft,-1), iVar20 == 0 &&
                    (iVar20 = sqlite3ExprCompare((Parse *)0x0,pWVar36->pExpr->pRight,
                                                 pWVar37->pExpr->pRight,-1), iVar20 == 0)) &&
                   (pEVar28 = sqlite3ExprDup(pWC->pWInfo->pParse->db,pWVar36->pExpr,0),
                   pEVar28 != (Expr *)0x0)))))) {
                uVar7 = 8;
                if ((uVar48 & 0x18) == 0) {
                  uVar7 = 0x20;
                }
                if ((uVar48 + 0x3f & uVar48) != 0) {
                  uVar48 = uVar7;
                }
                bVar42 = 0;
                do {
                  bVar41 = bVar42;
                  bVar42 = bVar41 + 1;
                } while (2 << (bVar41 & 0x1f) != (uint)uVar48);
                pEVar28->op = bVar41 + 0x35;
                iVar20 = whereClauseInsert(pWC,pEVar28,3);
                exprAnalyze(pSrc,pWC,iVar20);
              }
              iVar23 = iVar23 + 1;
              pWVar50 = (pWC_00->wc).a;
            }
          }
        }
        if (uVar47 != 0) {
          bVar52 = false;
          iVar19 = -1;
          for (uVar44 = 0; (!bVar52 && (uVar44 < 2)); uVar44 = uVar44 + 1) {
            pWVar50 = (pWC_00->wc).a;
            iVar23 = (pWC_00->wc).nTerm;
            while( true ) {
              if (iVar23 < 1) goto LAB_001770b7;
              *(byte *)&pWVar50->wtFlags = (byte)pWVar50->wtFlags & 0xbf;
              iVar20 = pWVar50->leftCursor;
              if ((iVar20 != iVar19) &&
                 (BVar24 = sqlite3WhereGetMask(pMaskSet,iVar20), (uVar47 & BVar24) != 0)) break;
              pWVar50 = pWVar50 + 1;
              iVar23 = iVar23 + -1;
            }
            iVar19 = (pWVar50->u).leftColumn;
            pEVar28 = pWVar50->pExpr->pLeft;
            bVar52 = true;
            while ((iVar23 = iVar23 + -1, bVar52 && (-1 < iVar23))) {
              if (pWVar50->leftCursor == iVar20) {
                bVar52 = false;
                if ((pWVar50->u).leftColumn == iVar19) {
                  pEVar38 = pWVar50->pExpr;
                  if (iVar19 == -2) {
                    iVar21 = sqlite3ExprCompare(pParse_00,pEVar38->pLeft,pEVar28,-1);
                    if (iVar21 != 0) goto LAB_00177852;
                    pEVar38 = pWVar50->pExpr;
                  }
                  cVar14 = sqlite3ExprAffinity(pEVar38->pRight);
                  cVar15 = sqlite3ExprAffinity(pWVar50->pExpr->pLeft);
                  if ((cVar14 == '\0') || (cVar14 == cVar15)) {
                    *(byte *)&pWVar50->wtFlags = (byte)pWVar50->wtFlags | 0x40;
                    goto LAB_0017784f;
                  }
                }
              }
              else {
                *(byte *)&pWVar50->wtFlags = (byte)pWVar50->wtFlags & 0xbf;
LAB_0017784f:
                bVar52 = true;
              }
LAB_00177852:
              pWVar50 = pWVar50 + 1;
            }
            iVar19 = iVar20;
          }
          if (bVar52) {
            pWVar50 = (pWC_00->wc).a;
            pEVar40 = (ExprList *)0x0;
            pEVar28 = (Expr *)0x0;
            for (iVar19 = (pWC_00->wc).nTerm; 0 < iVar19; iVar19 = iVar19 + -1) {
              if ((pWVar50->wtFlags & 0x40) != 0) {
                pEVar28 = sqlite3ExprDup(psVar9,pWVar50->pExpr->pRight,0);
                pEVar40 = sqlite3ExprListAppend(pWVar12->pParse,pEVar40,pEVar28);
                pEVar28 = pWVar50->pExpr->pLeft;
              }
              pWVar50 = pWVar50 + 1;
            }
            pEVar28 = sqlite3ExprDup(psVar9,pEVar28,0);
            pEVar28 = sqlite3PExpr(pParse_00,0x31,pEVar28,(Expr *)0x0);
            if (pEVar28 == (Expr *)0x0) {
              sqlite3ExprListDelete(psVar9,pEVar40);
            }
            else {
              pEVar28->flags = pEVar28->flags | pEVar27->flags & 1;
              pEVar28->iRightJoinTable = pEVar27->iRightJoinTable;
              (pEVar28->x).pList = pEVar40;
              iVar19 = whereClauseInsert(pWC,pEVar28,3);
              exprAnalyze(pSrc,pWC,iVar19);
              markTermAsChild(pWC,iVar19,idxTerm);
            }
          }
        }
      }
    }
LAB_001770b7:
    local_d8 = pWC->a + idxTerm;
  }
  else if ((pIn->op == '0') && (pWC->op == ',')) {
    pEVar49 = ((pIn->x).pList)->a;
    for (lVar46 = 0; lVar46 != 2; lVar46 = lVar46 + 1) {
      bVar42 = "97"[lVar46];
      pEVar27 = sqlite3ExprDup(db,pIn->pLeft,0);
      pEVar28 = sqlite3ExprDup(db,pEVar49->pExpr,0);
      pEVar27 = sqlite3PExpr(pParse,(uint)bVar42,pEVar27,pEVar28);
      transferJoinMarkings(pEVar27,pIn);
      iVar19 = whereClauseInsert(pWC,pEVar27,3);
      exprAnalyze(pSrc,pWC,iVar19);
      local_d8 = pWC->a + idxTerm;
      markTermAsChild(pWC,iVar19,idxTerm);
      pEVar49 = pEVar49 + 1;
    }
  }
  if (pWC->op != ',') goto LAB_001773f8;
  if ((pIn->op == 0xa1) && ((pIn->x).pList != (ExprList *)0x0)) {
    psVar9 = pParse->db;
    iVar19 = ((pIn->x).pList)->nExpr;
    pFVar30 = sqlite3FindFunction(psVar9,(pIn->u).zToken,iVar19,'\x01','\0');
    if ((pFVar30 != (FuncDef *)0x0) && (uVar44 = pFVar30->funcFlags, (uVar44 & 4) != 0)) {
      pSVar10 = (pIn->x).pSelect;
      if (iVar19 < 3) {
        bVar42 = 0;
LAB_00176e21:
        pbVar31 = (byte *)pFVar30->pUserData;
        bVar41 = *pbVar31;
        bVar4 = pbVar31[1];
        bVar5 = pbVar31[2];
        pSVar11 = pSVar10->pSrc;
        pEVar27 = sqlite3ExprSkipCollate(*(Expr **)&pSVar10->op);
        uVar16 = pEVar27->op;
        if (uVar16 == 0x94) {
          if ((psVar9->flags & 0x800000) == 0) {
            sVar18 = pEVar27->iColumn;
            pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar18,aff);
            if ((pVal == (sqlite3_value *)0x0) || ((pVal->flags & 0xf) != 2)) {
              pbVar31 = (byte *)0x0;
            }
            else {
              pbVar31 = sqlite3_value_text(pVal);
            }
            uVar22 = 0x80000000;
            if (sVar18 < 0x20) {
              uVar22 = 1 << ((char)sVar18 - 1U & 0x1f);
            }
            puVar1 = &pParse->pVdbe->expmask;
            *puVar1 = *puVar1 | uVar22;
            goto LAB_00177895;
          }
LAB_00177139:
          bVar52 = true;
          pVal = (sqlite3_value *)0x0;
          pEVar28 = (Expr *)0x0;
          bVar53 = false;
        }
        else {
          if (uVar16 != 'n') goto LAB_00177139;
          pbVar31 = (byte *)(pEVar27->u).zToken;
          pVal = (sqlite3_value *)0x0;
LAB_00177895:
          if (pbVar31 != (byte *)0x0) {
            uVar47 = 0;
            while( true ) {
              iVar19 = (int)uVar47;
              lVar46 = (long)iVar19;
              bVar6 = pbVar31[lVar46];
              if ((((bVar6 == 0) || (bVar6 == bVar41)) || (bVar6 == bVar4)) || (bVar6 == bVar5))
              break;
              uVar47 = lVar46 + 1;
              if ((bVar6 == bVar42) && (pbVar31[uVar47] != 0)) {
                uVar47 = (ulong)(iVar19 + 2);
              }
            }
            if (((iVar19 != 0) && (pbVar31[lVar46 + -1] != 0xff)) &&
               ((1 < iVar19 || (*pbVar31 != bVar42)))) {
              bVar53 = false;
              if (bVar6 == bVar41) {
                bVar53 = pbVar31[lVar46 + 1] == 0;
              }
              pEVar28 = sqlite3Expr(psVar9,0x6e,(char *)pbVar31);
              if (pEVar28 != (Expr *)0x0) {
                pbVar31 = (byte *)(pEVar28->u).zToken;
                pbVar31[lVar46] = 0;
                uVar47 = 0;
                for (iVar23 = 0; iVar23 < iVar19;
                    iVar23 = iVar23 + (uint)((int)(char)bVar41 == (uint)bVar42) + 1) {
                  bVar41 = pbVar31[iVar23];
                  pbVar31[uVar47] =
                       pbVar31[(int)(iVar23 + (uint)((int)(char)bVar41 == (uint)bVar42))];
                  uVar47 = uVar47 + 1;
                }
                pbVar31[uVar47 & 0xffffffff] = 0;
                bVar42 = *pbVar31;
                if ((((ulong)bVar42 - 0x30 < 10 || (ulong)bVar42 == 0x2d) ||
                    (uVar47 == 1 && bVar42 == 0x2f)) &&
                   (((char)pSVar11->nSrc != -0x5e ||
                    ((cVar14 = sqlite3ExprAffinity((Expr *)pSVar11), cVar14 != 'B' ||
                     (*(int *)(*(long *)&pSVar11->a[0].regResult + 0x54) != 0)))))) {
                  sqlite3ExprDeleteNN(psVar9,pEVar28);
                  sqlite3ValueFree(pVal);
                  goto LAB_00176ec7;
                }
              }
              if (uVar16 == 0x94) {
                p = pParse->pVdbe;
                uVar8 = pEVar27->iColumn;
                uVar22 = 0x80000000;
                if ((short)uVar8 < 0x20) {
                  uVar22 = 1 << ((char)uVar8 - 1U & 0x1f);
                }
                p->expmask = p->expmask | uVar22;
                if (bVar53) {
                  if ((pEVar27->u).zToken[1] != '\0') {
                    iVar19 = sqlite3GetTempReg(pParse);
                    sqlite3ExprCodeTarget(pParse,pEVar27,iVar19);
                    pVVar39 = sqlite3VdbeGetOp(p,p->nOp + -1);
                    pVVar39->p3 = 0;
                    if (iVar19 != 0) {
                      bVar42 = pParse->nTempReg;
                      if ((ulong)bVar42 < 8) {
                        pParse->nTempReg = bVar42 + 1;
                        pParse->aTempReg[bVar42] = iVar19;
                      }
                    }
                  }
                  bVar52 = false;
                  goto LAB_001779a3;
                }
                bVar53 = false;
              }
              bVar52 = false;
              goto LAB_001779a3;
            }
          }
          bVar53 = false;
          pEVar28 = (Expr *)0x0;
          bVar52 = true;
        }
LAB_001779a3:
        sqlite3ValueFree(pVal);
        if (!bVar52) {
          pSVar11 = ((pIn->x).pSelect)->pSrc;
          pEVar27 = sqlite3ExprDup(db,pEVar28,0);
          if (((uVar44 & 8) == 0) && (pParse->db->mallocFailed == '\0')) {
            pbVar31 = (byte *)((long)&local_d8->wtFlags + 1);
            *pbVar31 = *pbVar31 | 4;
            lVar46 = 0;
            while( true ) {
              bVar42 = (pEVar28->u).zToken[lVar46];
              uVar47 = (ulong)bVar42;
              if (uVar47 == 0) break;
              (pEVar28->u).zToken[lVar46] = (~""[uVar47] | 0xdf) & bVar42;
              (pEVar27->u).zToken[lVar46] = ""[uVar47];
              lVar46 = lVar46 + 1;
            }
          }
          if (db->mallocFailed == '\0') {
            pcVar51 = (pEVar27->u).zToken;
            uVar22 = sqlite3Strlen30(pcVar51);
            bVar42 = pcVar51[(ulong)uVar22 - 1];
            if ((uVar44 & 8) == 0) {
              if (bVar42 == 0x40) {
                bVar53 = false;
              }
              bVar42 = ""[bVar42];
            }
            pcVar51[(ulong)uVar22 - 1] = bVar42 + 1;
          }
          pcVar51 = "BINARY";
          if ((uVar44 & 8) == 0) {
            pcVar51 = "NOCASE";
          }
          pEVar38 = sqlite3ExprDup(db,(Expr *)pSVar11,0);
          pEVar38 = sqlite3ExprAddCollateString(pParse,pEVar38,pcVar51);
          pEVar28 = sqlite3PExpr(pParse,0x39,pEVar38,pEVar28);
          transferJoinMarkings(pEVar28,pIn);
          iVar19 = whereClauseInsert(pWC,pEVar28,0x103);
          exprAnalyze(pSrc,pWC,iVar19);
          pEVar28 = sqlite3ExprDup(db,(Expr *)pSVar11,0);
          pEVar28 = sqlite3ExprAddCollateString(pParse,pEVar28,pcVar51);
          pEVar27 = sqlite3PExpr(pParse,0x38,pEVar28,pEVar27);
          transferJoinMarkings(pEVar27,pIn);
          iVar23 = whereClauseInsert(pWC,pEVar27,0x103);
          exprAnalyze(pSrc,pWC,iVar23);
          local_d8 = pWC->a + idxTerm;
          if (bVar53) {
            markTermAsChild(pWC,iVar19,idxTerm);
            markTermAsChild(pWC,iVar23,idxTerm);
          }
        }
      }
      else if ((char)pSVar10->pOrderBy->nExpr == 'n') {
        pEVar27 = pSVar10->pOrderBy->a[0].pExpr;
        bVar42 = pEVar27->op;
        if ((bVar42 != 0) && (pEVar27->affinity == '\0')) goto LAB_00176e21;
      }
    }
  }
LAB_00176ec7:
  if (pWC->op != ',') goto LAB_001773f8;
  bVar42 = pIn->op;
  if ((bVar42 - 0x33 < 2) || (bVar42 == 0xa0)) {
    pEVar27 = pIn->pLeft;
    pEVar28 = pIn->pRight;
    uVar44 = 0;
    if (pEVar27->op == 0xa2) {
      uVar44 = (uint)(((pEVar27->y).pTab)->nModuleArg != 0);
    }
    if (pEVar28 == (Expr *)0x0) {
      pEVar38 = (Expr *)0x0;
    }
    else {
      pEVar38 = pEVar28;
      if ((pEVar28->op == 0xa2) && (((pEVar28->y).pTab)->nModuleArg != 0)) {
        uVar44 = uVar44 + 1;
        pEVar38 = pEVar27;
        pEVar27 = pEVar28;
      }
    }
    if (bVar42 == 0xa0) {
      uVar22 = 0x45;
    }
    else if (bVar42 == 0x34) {
      uVar22 = 0x44;
    }
    else if (bVar42 == 0x33) {
      uVar22 = 0x46;
    }
    else {
      uVar22 = 0;
    }
  }
  else {
    if (((bVar42 == 0xa1) && (pEVar40 = (pIn->x).pList, pEVar40 != (ExprList *)0x0)) &&
       (pEVar40->nExpr == 2)) {
      uVar44 = 1;
      pEVar27 = *(Expr **)(pEVar40 + 1);
      if ((pEVar27->op == 0xa2) && (((pEVar27->y).pTab)->nModuleArg != 0)) {
        pcVar51 = (pIn->u).zToken;
        lVar46 = 0;
        do {
          lVar43 = lVar46;
          if (lVar43 + 0x10 == 0x50) goto LAB_00177156;
          iVar19 = sqlite3StrICmp(pcVar51,*(char **)((long)&isAuxiliaryVtabOperator_aOp + lVar43));
          lVar46 = lVar43 + 0x10;
        } while (iVar19 != 0);
        uVar22 = (uint)(byte)(&DAT_001c57b8)[lVar43];
        pEVar38 = pEVar40->a[0].pExpr;
        goto LAB_001771d2;
      }
LAB_00177156:
      pEVar27 = pEVar40->a[0].pExpr;
      if ((pEVar27->op == 0xa2) && (((pEVar27->y).pTab)->nModuleArg != 0)) {
        pVVar32 = sqlite3GetVTable(db,(pEVar27->y).pTab);
        p_Var13 = pVVar32->pVtab->pModule->xFindFunction;
        if ((p_Var13 !=
             (_func_int_sqlite3_vtab_ptr_int_char_ptr_anon_subr_ptr_ptr_void_ptr_ptr *)0x0) &&
           (uVar22 = (*p_Var13)(pVVar32->pVtab,2,(pIn->u).zToken,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **)
                                aiCurCol,&local_38), 0x95 < (int)uVar22)) {
          pEVar38 = *(Expr **)(pEVar40 + 1);
          goto LAB_001771d2;
        }
      }
    }
    uVar22 = 0;
    uVar44 = 0;
    pEVar38 = (Expr *)0x0;
    pEVar27 = (Expr *)0x0;
  }
LAB_001771d2:
  while (pEVar28 = pEVar27, pEVar27 = pEVar38, 0 < (int)uVar44) {
    uVar44 = uVar44 - 1;
    BVar24 = sqlite3WhereExprUsage(pMaskSet_00,pEVar27);
    BVar25 = sqlite3WhereExprUsage(pMaskSet_00,pEVar28);
    pEVar38 = pEVar28;
    if ((BVar25 & BVar24) == 0) {
      pEVar33 = sqlite3ExprDup(db,pEVar27,0);
      pEVar33 = sqlite3PExpr(pParse,0x2e,(Expr *)0x0,pEVar33);
      if (((pIn->flags & 1) != 0) && (pEVar33 != (Expr *)0x0)) {
        *(byte *)&pEVar33->flags = (byte)pEVar33->flags | 1;
      }
      iVar19 = whereClauseInsert(pWC,pEVar33,3);
      pWVar50 = pWC->a;
      pWVar50[iVar19].prereqRight = BVar24;
      pWVar50[iVar19].leftCursor = pEVar28->iTable;
      *(int *)&pWVar50[iVar19].u = (int)pEVar28->iColumn;
      pWVar50[iVar19].eOperator = 0x40;
      pWVar50[iVar19].eMatchOp = (u8)uVar22;
      markTermAsChild(pWC,iVar19,idxTerm);
      pWVar36 = pWC->a;
      pWVar36[idxTerm].wtFlags = pWVar36[idxTerm].wtFlags | 8;
      local_d8 = pWVar36 + idxTerm;
      pWVar50[iVar19].prereqAll = pWVar36[idxTerm].prereqAll;
    }
  }
  if (pWC->op == ',') {
    uVar16 = pIn->op;
    if ((uVar16 == '5') || (uVar16 == '-')) {
      pEVar27 = pIn->pLeft;
      iVar19 = sqlite3ExprVectorSize(pEVar27);
      if (1 < iVar19) {
        pEVar28 = pIn->pRight;
        iVar23 = sqlite3ExprVectorSize(pEVar28);
        if ((iVar23 == iVar19) &&
           (((pEVar27->flags & 0x800) == 0 || ((pEVar28->flags & 0x800) == 0)))) {
          for (iVar23 = 0; iVar19 != iVar23; iVar23 = iVar23 + 1) {
            pEVar27 = sqlite3ExprForVectorField(pParse,pIn->pLeft,iVar23);
            pEVar28 = sqlite3ExprForVectorField(pParse,pIn->pRight,iVar23);
            pEVar27 = sqlite3PExpr(pParse,(uint)pIn->op,pEVar27,pEVar28);
            transferJoinMarkings(pEVar27,pIn);
            iVar20 = whereClauseInsert(pWC,pEVar27,1);
            exprAnalyze(pSrc,pWC,iVar20);
          }
          local_d8 = pWC->a;
          local_d8[idxTerm].wtFlags = local_d8[idxTerm].wtFlags | 6;
          local_d8[idxTerm].eOperator = 0;
          if (pWC->op != ',') goto LAB_001773f8;
          local_d8 = local_d8 + idxTerm;
        }
      }
      uVar16 = pIn->op;
    }
    if ((((uVar16 == '1') && (local_d8->iField == 0)) && (pEVar27 = pIn->pLeft, pEVar27->op == 0xa9)
        ) && (((pIn->x).pSelect)->pPrior == (Select *)0x0)) {
      for (iVar19 = 1; iVar23 = sqlite3ExprVectorSize(pEVar27), iVar19 + -1 < iVar23;
          iVar19 = iVar19 + 1) {
        iVar23 = whereClauseInsert(pWC,pIn,2);
        pWC->a[iVar23].iField = iVar19;
        exprAnalyze(pSrc,pWC,iVar23);
        markTermAsChild(pWC,iVar23,idxTerm);
        pEVar27 = pIn->pLeft;
      }
    }
  }
LAB_001773f8:
  pBVar3 = &pWC->a[idxTerm].prereqRight;
  *pBVar3 = *pBVar3 | local_48;
  return;
}

Assistant:

static void exprAnalyze(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the WHERE clause */
  int idxTerm               /* Index of the term to be analyzed */
){
  WhereInfo *pWInfo = pWC->pWInfo; /* WHERE clause processing context */
  WhereTerm *pTerm;                /* The term to be analyzed */
  WhereMaskSet *pMaskSet;          /* Set of table index masks */
  Expr *pExpr;                     /* The expression to be analyzed */
  Bitmask prereqLeft;              /* Prerequesites of the pExpr->pLeft */
  Bitmask prereqAll;               /* Prerequesites of pExpr */
  Bitmask extraRight = 0;          /* Extra dependencies on LEFT JOIN */
  Expr *pStr1 = 0;                 /* RHS of LIKE/GLOB operator */
  int isComplete = 0;              /* RHS of LIKE/GLOB ends with wildcard */
  int noCase = 0;                  /* uppercase equivalent to lowercase */
  int op;                          /* Top-level operator.  pExpr->op */
  Parse *pParse = pWInfo->pParse;  /* Parsing context */
  sqlite3 *db = pParse->db;        /* Database connection */
  unsigned char eOp2 = 0;          /* op2 value for LIKE/REGEXP/GLOB */
  int nLeft;                       /* Number of elements on left side vector */

  if( db->mallocFailed ){
    return;
  }
  pTerm = &pWC->a[idxTerm];
  pMaskSet = &pWInfo->sMaskSet;
  pExpr = pTerm->pExpr;
  assert( pExpr->op!=TK_AS && pExpr->op!=TK_COLLATE );
  prereqLeft = sqlite3WhereExprUsage(pMaskSet, pExpr->pLeft);
  op = pExpr->op;
  if( op==TK_IN ){
    assert( pExpr->pRight==0 );
    if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      pTerm->prereqRight = exprSelectUsage(pMaskSet, pExpr->x.pSelect);
    }else{
      pTerm->prereqRight = sqlite3WhereExprListUsage(pMaskSet, pExpr->x.pList);
    }
  }else if( op==TK_ISNULL ){
    pTerm->prereqRight = 0;
  }else{
    pTerm->prereqRight = sqlite3WhereExprUsage(pMaskSet, pExpr->pRight);
  }
  pMaskSet->bVarSelect = 0;
  prereqAll = sqlite3WhereExprUsageNN(pMaskSet, pExpr);
  if( pMaskSet->bVarSelect ) pTerm->wtFlags |= TERM_VARSELECT;
  if( ExprHasProperty(pExpr, EP_FromJoin) ){
    Bitmask x = sqlite3WhereGetMask(pMaskSet, pExpr->iRightJoinTable);
    prereqAll |= x;
    extraRight = x-1;  /* ON clause terms may not be used with an index
                       ** on left table of a LEFT JOIN.  Ticket #3015 */
    if( (prereqAll>>1)>=x ){
      sqlite3ErrorMsg(pParse, "ON clause references tables to its right");
      return;
    }
  }
  pTerm->prereqAll = prereqAll;
  pTerm->leftCursor = -1;
  pTerm->iParent = -1;
  pTerm->eOperator = 0;
  if( allowedOp(op) ){
    int aiCurCol[2];
    Expr *pLeft = sqlite3ExprSkipCollate(pExpr->pLeft);
    Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
    u16 opMask = (pTerm->prereqRight & prereqLeft)==0 ? WO_ALL : WO_EQUIV;

    if( pTerm->iField>0 ){
      assert( op==TK_IN );
      assert( pLeft->op==TK_VECTOR );
      pLeft = pLeft->x.pList->a[pTerm->iField-1].pExpr;
    }

    if( exprMightBeIndexed(pSrc, prereqLeft, aiCurCol, pLeft, op) ){
      pTerm->leftCursor = aiCurCol[0];
      pTerm->u.leftColumn = aiCurCol[1];
      pTerm->eOperator = operatorMask(op) & opMask;
    }
    if( op==TK_IS ) pTerm->wtFlags |= TERM_IS;
    if( pRight 
     && exprMightBeIndexed(pSrc, pTerm->prereqRight, aiCurCol, pRight, op)
    ){
      WhereTerm *pNew;
      Expr *pDup;
      u16 eExtraOp = 0;        /* Extra bits for pNew->eOperator */
      assert( pTerm->iField==0 );
      if( pTerm->leftCursor>=0 ){
        int idxNew;
        pDup = sqlite3ExprDup(db, pExpr, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pDup);
          return;
        }
        idxNew = whereClauseInsert(pWC, pDup, TERM_VIRTUAL|TERM_DYNAMIC);
        if( idxNew==0 ) return;
        pNew = &pWC->a[idxNew];
        markTermAsChild(pWC, idxNew, idxTerm);
        if( op==TK_IS ) pNew->wtFlags |= TERM_IS;
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;

        if( termIsEquivalence(pParse, pDup) ){
          pTerm->eOperator |= WO_EQUIV;
          eExtraOp = WO_EQUIV;
        }
      }else{
        pDup = pExpr;
        pNew = pTerm;
      }
      exprCommute(pParse, pDup);
      pNew->leftCursor = aiCurCol[0];
      pNew->u.leftColumn = aiCurCol[1];
      testcase( (prereqLeft | extraRight) != prereqLeft );
      pNew->prereqRight = prereqLeft | extraRight;
      pNew->prereqAll = prereqAll;
      pNew->eOperator = (operatorMask(pDup->op) + eExtraOp) & opMask;
    }
  }

#ifndef SQLITE_OMIT_BETWEEN_OPTIMIZATION
  /* If a term is the BETWEEN operator, create two new virtual terms
  ** that define the range that the BETWEEN implements.  For example:
  **
  **      a BETWEEN b AND c
  **
  ** is converted into:
  **
  **      (a BETWEEN b AND c) AND (a>=b) AND (a<=c)
  **
  ** The two new terms are added onto the end of the WhereClause object.
  ** The new terms are "dynamic" and are children of the original BETWEEN
  ** term.  That means that if the BETWEEN term is coded, the children are
  ** skipped.  Or, if the children are satisfied by an index, the original
  ** BETWEEN term is skipped.
  */
  else if( pExpr->op==TK_BETWEEN && pWC->op==TK_AND ){
    ExprList *pList = pExpr->x.pList;
    int i;
    static const u8 ops[] = {TK_GE, TK_LE};
    assert( pList!=0 );
    assert( pList->nExpr==2 );
    for(i=0; i<2; i++){
      Expr *pNewExpr;
      int idxNew;
      pNewExpr = sqlite3PExpr(pParse, ops[i], 
                             sqlite3ExprDup(db, pExpr->pLeft, 0),
                             sqlite3ExprDup(db, pList->a[i].pExpr, 0));
      transferJoinMarkings(pNewExpr, pExpr);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      exprAnalyze(pSrc, pWC, idxNew);
      pTerm = &pWC->a[idxTerm];
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_BETWEEN_OPTIMIZATION */

#if !defined(SQLITE_OMIT_OR_OPTIMIZATION) && !defined(SQLITE_OMIT_SUBQUERY)
  /* Analyze a term that is composed of two or more subterms connected by
  ** an OR operator.
  */
  else if( pExpr->op==TK_OR ){
    assert( pWC->op==TK_AND );
    exprAnalyzeOrTerm(pSrc, pWC, idxTerm);
    pTerm = &pWC->a[idxTerm];
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */

#ifndef SQLITE_OMIT_LIKE_OPTIMIZATION
  /* Add constraints to reduce the search space on a LIKE or GLOB
  ** operator.
  **
  ** A like pattern of the form "x LIKE 'aBc%'" is changed into constraints
  **
  **          x>='ABC' AND x<'abd' AND x LIKE 'aBc%'
  **
  ** The last character of the prefix "abc" is incremented to form the
  ** termination condition "abd".  If case is not significant (the default
  ** for LIKE) then the lower-bound is made all uppercase and the upper-
  ** bound is made all lowercase so that the bounds also work when comparing
  ** BLOBs.
  */
  if( pWC->op==TK_AND 
   && isLikeOrGlob(pParse, pExpr, &pStr1, &isComplete, &noCase)
  ){
    Expr *pLeft;       /* LHS of LIKE/GLOB operator */
    Expr *pStr2;       /* Copy of pStr1 - RHS of LIKE/GLOB operator */
    Expr *pNewExpr1;
    Expr *pNewExpr2;
    int idxNew1;
    int idxNew2;
    const char *zCollSeqName;     /* Name of collating sequence */
    const u16 wtFlags = TERM_LIKEOPT | TERM_VIRTUAL | TERM_DYNAMIC;

    pLeft = pExpr->x.pList->a[1].pExpr;
    pStr2 = sqlite3ExprDup(db, pStr1, 0);

    /* Convert the lower bound to upper-case and the upper bound to
    ** lower-case (upper-case is less than lower-case in ASCII) so that
    ** the range constraints also work for BLOBs
    */
    if( noCase && !pParse->db->mallocFailed ){
      int i;
      char c;
      pTerm->wtFlags |= TERM_LIKE;
      for(i=0; (c = pStr1->u.zToken[i])!=0; i++){
        pStr1->u.zToken[i] = sqlite3Toupper(c);
        pStr2->u.zToken[i] = sqlite3Tolower(c);
      }
    }

    if( !db->mallocFailed ){
      u8 c, *pC;       /* Last character before the first wildcard */
      pC = (u8*)&pStr2->u.zToken[sqlite3Strlen30(pStr2->u.zToken)-1];
      c = *pC;
      if( noCase ){
        /* The point is to increment the last character before the first
        ** wildcard.  But if we increment '@', that will push it into the
        ** alphabetic range where case conversions will mess up the 
        ** inequality.  To avoid this, make sure to also run the full
        ** LIKE on all candidate expressions by clearing the isComplete flag
        */
        if( c=='A'-1 ) isComplete = 0;
        c = sqlite3UpperToLower[c];
      }
      *pC = c + 1;
    }
    zCollSeqName = noCase ? "NOCASE" : sqlite3StrBINARY;
    pNewExpr1 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr1 = sqlite3PExpr(pParse, TK_GE,
           sqlite3ExprAddCollateString(pParse,pNewExpr1,zCollSeqName),
           pStr1);
    transferJoinMarkings(pNewExpr1, pExpr);
    idxNew1 = whereClauseInsert(pWC, pNewExpr1, wtFlags);
    testcase( idxNew1==0 );
    exprAnalyze(pSrc, pWC, idxNew1);
    pNewExpr2 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr2 = sqlite3PExpr(pParse, TK_LT,
           sqlite3ExprAddCollateString(pParse,pNewExpr2,zCollSeqName),
           pStr2);
    transferJoinMarkings(pNewExpr2, pExpr);
    idxNew2 = whereClauseInsert(pWC, pNewExpr2, wtFlags);
    testcase( idxNew2==0 );
    exprAnalyze(pSrc, pWC, idxNew2);
    pTerm = &pWC->a[idxTerm];
    if( isComplete ){
      markTermAsChild(pWC, idxNew1, idxTerm);
      markTermAsChild(pWC, idxNew2, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_LIKE_OPTIMIZATION */

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Add a WO_AUX auxiliary term to the constraint set if the
  ** current expression is of the form "column OP expr" where OP
  ** is an operator that gets passed into virtual tables but which is
  ** not normally optimized for ordinary tables.  In other words, OP
  ** is one of MATCH, LIKE, GLOB, REGEXP, !=, IS, IS NOT, or NOT NULL.
  ** This information is used by the xBestIndex methods of
  ** virtual tables.  The native query optimizer does not attempt
  ** to do anything with MATCH functions.
  */
  if( pWC->op==TK_AND ){
    Expr *pRight = 0, *pLeft = 0;
    int res = isAuxiliaryVtabOperator(db, pExpr, &eOp2, &pLeft, &pRight);
    while( res-- > 0 ){
      int idxNew;
      WhereTerm *pNewTerm;
      Bitmask prereqColumn, prereqExpr;

      prereqExpr = sqlite3WhereExprUsage(pMaskSet, pRight);
      prereqColumn = sqlite3WhereExprUsage(pMaskSet, pLeft);
      if( (prereqExpr & prereqColumn)==0 ){
        Expr *pNewExpr;
        pNewExpr = sqlite3PExpr(pParse, TK_MATCH, 
            0, sqlite3ExprDup(db, pRight, 0));
        if( ExprHasProperty(pExpr, EP_FromJoin) && pNewExpr ){
          ExprSetProperty(pNewExpr, EP_FromJoin);
        }
        idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
        testcase( idxNew==0 );
        pNewTerm = &pWC->a[idxNew];
        pNewTerm->prereqRight = prereqExpr;
        pNewTerm->leftCursor = pLeft->iTable;
        pNewTerm->u.leftColumn = pLeft->iColumn;
        pNewTerm->eOperator = WO_AUX;
        pNewTerm->eMatchOp = eOp2;
        markTermAsChild(pWC, idxNew, idxTerm);
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;
        pNewTerm->prereqAll = pTerm->prereqAll;
      }
      SWAP(Expr*, pLeft, pRight);
    }
  }
#endif /* SQLITE_OMIT_VIRTUALTABLE */

  /* If there is a vector == or IS term - e.g. "(a, b) == (?, ?)" - create
  ** new terms for each component comparison - "a = ?" and "b = ?".  The
  ** new terms completely replace the original vector comparison, which is
  ** no longer used.
  **
  ** This is only required if at least one side of the comparison operation
  ** is not a sub-select.  */
  if( pWC->op==TK_AND 
  && (pExpr->op==TK_EQ || pExpr->op==TK_IS)
  && (nLeft = sqlite3ExprVectorSize(pExpr->pLeft))>1
  && sqlite3ExprVectorSize(pExpr->pRight)==nLeft
  && ( (pExpr->pLeft->flags & EP_xIsSelect)==0 
    || (pExpr->pRight->flags & EP_xIsSelect)==0)
  ){
    int i;
    for(i=0; i<nLeft; i++){
      int idxNew;
      Expr *pNew;
      Expr *pLeft = sqlite3ExprForVectorField(pParse, pExpr->pLeft, i);
      Expr *pRight = sqlite3ExprForVectorField(pParse, pExpr->pRight, i);

      pNew = sqlite3PExpr(pParse, pExpr->op, pLeft, pRight);
      transferJoinMarkings(pNew, pExpr);
      idxNew = whereClauseInsert(pWC, pNew, TERM_DYNAMIC);
      exprAnalyze(pSrc, pWC, idxNew);
    }
    pTerm = &pWC->a[idxTerm];
    pTerm->wtFlags |= TERM_CODED|TERM_VIRTUAL;  /* Disable the original */
    pTerm->eOperator = 0;
  }

  /* If there is a vector IN term - e.g. "(a, b) IN (SELECT ...)" - create
  ** a virtual term for each vector component. The expression object
  ** used by each such virtual term is pExpr (the full vector IN(...) 
  ** expression). The WhereTerm.iField variable identifies the index within
  ** the vector on the LHS that the virtual term represents.
  **
  ** This only works if the RHS is a simple SELECT, not a compound
  */
  if( pWC->op==TK_AND && pExpr->op==TK_IN && pTerm->iField==0
   && pExpr->pLeft->op==TK_VECTOR
   && pExpr->x.pSelect->pPrior==0
  ){
    int i;
    for(i=0; i<sqlite3ExprVectorSize(pExpr->pLeft); i++){
      int idxNew;
      idxNew = whereClauseInsert(pWC, pExpr, TERM_VIRTUAL);
      pWC->a[idxNew].iField = i+1;
      exprAnalyze(pSrc, pWC, idxNew);
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }

#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  /* When sqlite_stat3 histogram data is available an operator of the
  ** form "x IS NOT NULL" can sometimes be evaluated more efficiently
  ** as "x>NULL" if x is not an INTEGER PRIMARY KEY.  So construct a
  ** virtual term of that form.
  **
  ** Note that the virtual term must be tagged with TERM_VNULL.
  */
  if( pExpr->op==TK_NOTNULL
   && pExpr->pLeft->op==TK_COLUMN
   && pExpr->pLeft->iColumn>=0
   && !ExprHasProperty(pExpr, EP_FromJoin)
   && OptimizationEnabled(db, SQLITE_Stat34)
  ){
    Expr *pNewExpr;
    Expr *pLeft = pExpr->pLeft;
    int idxNew;
    WhereTerm *pNewTerm;

    pNewExpr = sqlite3PExpr(pParse, TK_GT,
                            sqlite3ExprDup(db, pLeft, 0),
                            sqlite3ExprAlloc(db, TK_NULL, 0, 0));

    idxNew = whereClauseInsert(pWC, pNewExpr,
                              TERM_VIRTUAL|TERM_DYNAMIC|TERM_VNULL);
    if( idxNew ){
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = 0;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_GT;
      markTermAsChild(pWC, idxNew, idxTerm);
      pTerm = &pWC->a[idxTerm];
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

  /* Prevent ON clause terms of a LEFT JOIN from being used to drive
  ** an index for tables to the left of the join.
  */
  testcase( pTerm!=&pWC->a[idxTerm] );
  pTerm = &pWC->a[idxTerm];
  pTerm->prereqRight |= extraRight;
}